

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O1

adt_error_t adt_ary_remove(adt_ary_t *self,void *pElem)

{
  adt_error_t aVar1;
  long lVar2;
  
  if (self == (adt_ary_t *)0x0) {
    return '\x01';
  }
  if (0 < (long)self->s32CurLen) {
    lVar2 = 0;
    do {
      if (self->pFirst[lVar2] == pElem) {
        aVar1 = adt_ary_splice(self,(int32_t)lVar2,1);
        return aVar1;
      }
      lVar2 = lVar2 + 1;
    } while (self->s32CurLen != lVar2);
  }
  return '\0';
}

Assistant:

adt_error_t adt_ary_remove(adt_ary_t *self, void *pElem)
{
   if (self != 0)
   {
      int32_t s32Index;
      adt_error_t result = ADT_NO_ERROR;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem){
            result = adt_ary_splice(self, s32Index, 1);
            break;
         }
      }
      return result;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}